

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.h
# Opt level: O3

void __thiscall gui::MultilineTextBox::~MultilineTextBox(MultilineTextBox *this)

{
  ~MultilineTextBox(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~MultilineTextBox() = default;